

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NDocSave(xmlDocPtr doc,xmlNodeSetPtr nodes,int mode,xmlChar **inclusive_ns_prefixes,
                  int with_comments,char *filename,int compression)

{
  int iVar1;
  int iVar2;
  xmlOutputBufferPtr buf;
  char *msg;
  char *pcVar3;
  
  if (filename == (char *)0x0) {
    msg = "Invalid argument\n";
    iVar1 = 0x73;
    pcVar3 = (char *)0x0;
  }
  else {
    buf = xmlOutputBufferCreateFilename(filename,(xmlCharEncodingHandlerPtr)0x0,compression);
    if (buf != (xmlOutputBufferPtr)0x0) {
      iVar1 = xmlC14NExecute(doc,xmlC14NIsNodeInNodeset,nodes,mode,inclusive_ns_prefixes,
                             with_comments,buf);
      iVar2 = xmlOutputBufferClose(buf);
      if (iVar1 < 0) {
        return -1;
      }
      return iVar2;
    }
    msg = "%s";
    pcVar3 = "creating temporary filename";
    iVar1 = 0x5dc;
  }
  xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,iVar1,(char *)0x0,msg,pcVar3);
  return -1;
}

Assistant:

int
xmlC14NDocSave(xmlDocPtr doc, xmlNodeSetPtr nodes,
               int mode, xmlChar ** inclusive_ns_prefixes,
               int with_comments, const char *filename, int compression)
{
    xmlOutputBufferPtr buf;
    int ret;

    if (filename == NULL) {
        xmlC14NErrParam(NULL);
        return (-1);
    }
#ifdef LIBXML_ZLIB_ENABLED
    if (compression < 0)
        compression = xmlGetCompressMode();
#endif

    /*
     * save the content to a temp buffer, use default UTF8 encoding.
     */
    buf = xmlOutputBufferCreateFilename(filename, NULL, compression);
    if (buf == NULL) {
        xmlC14NErr(NULL, NULL, XML_IO_UNKNOWN, "creating temporary filename");
        return (-1);
    }

    /*
     * canonize document and write to buffer
     */
    ret = xmlC14NDocSaveTo(doc, nodes, mode, inclusive_ns_prefixes,
                           with_comments, buf);
    if (ret < 0) {
        (void) xmlOutputBufferClose(buf);
        return (-1);
    }

    /*
     * get the numbers of bytes written
     */
    ret = xmlOutputBufferClose(buf);
    return (ret);
}